

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::DefineOwnPropertyDescriptor
               (RecyclableObject *obj,PropertyId propId,PropertyDescriptor *descriptor,
               bool throwOnError,ScriptContext *scriptContext,PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  undefined4 *puVar5;
  PropertyDescriptor *local_98;
  undefined1 local_70 [3];
  bool isExtensible;
  BOOL isCurrentDescriptorDefined;
  PropertyDescriptor currentDescriptor;
  BOOL wrapperResult;
  PropertyOperationFlags flags_local;
  ScriptContext *scriptContext_local;
  bool throwOnError_local;
  PropertyDescriptor *descriptor_local;
  PropertyId propId_local;
  RecyclableObject *obj_local;
  
  currentDescriptor._44_4_ = flags;
  if (obj == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2392,"(obj)","obj");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2393,"(scriptContext)","scriptContext");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(obj);
  if (bVar2) {
    obj_local._4_4_ =
         Js::JavascriptProxy::DefineOwnPropertyDescriptor
                   (obj,propId,descriptor,throwOnError,scriptContext,currentDescriptor._44_4_);
  }
  else {
    bVar2 = VarIs<Js::CustomExternalWrapperObject,Js::RecyclableObject>(obj);
    if (bVar2) {
      BVar3 = Js::CustomExternalWrapperObject::DefineOwnPropertyDescriptor
                        (obj,propId,descriptor,throwOnError,scriptContext);
      if (BVar3 != 0) {
        return 1;
      }
      currentDescriptor.Configurable = false;
      currentDescriptor.fromProxy = false;
      currentDescriptor._42_2_ = 0;
    }
    PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_70);
    BVar3 = GetOwnPropertyDescriptor(obj,propId,scriptContext,(PropertyDescriptor *)local_70);
    iVar4 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x33])();
    if (BVar3 == 0) {
      local_98 = (PropertyDescriptor *)0x0;
    }
    else {
      local_98 = (PropertyDescriptor *)local_70;
    }
    obj_local._4_4_ =
         ValidateAndApplyPropertyDescriptor<true>
                   (obj,propId,descriptor,local_98,iVar4 != 0,throwOnError,scriptContext);
  }
  return obj_local._4_4_;
}

Assistant:

BOOL JavascriptOperators::DefineOwnPropertyDescriptor(RecyclableObject* obj, PropertyId propId, const PropertyDescriptor& descriptor, bool throwOnError, ScriptContext* scriptContext, PropertyOperationFlags flags /*  = Js::PropertyOperation_None */)
    {
        Assert(obj);
        Assert(scriptContext);

        if (VarIs<JavascriptProxy>(obj))
        {
            return JavascriptProxy::DefineOwnPropertyDescriptor(obj, propId, descriptor, throwOnError, scriptContext, flags);
        }
#ifdef _CHAKRACOREBUILD
        else if (VarIs<CustomExternalWrapperObject>(obj))
        {
            // See if there is a trap for defineProperty.
            BOOL wrapperResult = CustomExternalWrapperObject::DefineOwnPropertyDescriptor(obj, propId, descriptor, throwOnError, scriptContext);
            if (wrapperResult)
            {
                return TRUE;
            }
        }
#endif

        PropertyDescriptor currentDescriptor;
        BOOL isCurrentDescriptorDefined = JavascriptOperators::GetOwnPropertyDescriptor(obj, propId, scriptContext, &currentDescriptor);

        bool isExtensible = !!obj->IsExtensible();
        return ValidateAndApplyPropertyDescriptor<true>(obj, propId, descriptor, isCurrentDescriptorDefined ? &currentDescriptor : nullptr, isExtensible, throwOnError, scriptContext);
    }